

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

Result * CoreML::Model::load(Result *__return_storage_ptr__,istream *in,Model *out)

{
  element_type *this;
  bool bVar1;
  size_type __dnew;
  IstreamInputStream rawInput;
  CodedInputStream codedInput;
  size_type local_f0;
  string local_e8;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  undefined1 local_b8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [3];
  CodedInputStream local_78;
  
  if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) {
    this = (out->m_spec).
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    google::protobuf::io::IstreamInputStream::IstreamInputStream
              ((IstreamInputStream *)local_c8,in,-1);
    local_78.buffer_ = (uint8 *)0x0;
    local_78.buffer_end_ = (uint8 *)0x0;
    local_78._24_6_ = 0;
    local_78.overflow_bytes_._2_2_ = 0;
    local_78.last_tag_ = 0;
    local_78.legitimate_message_end_ = false;
    local_78.aliasing_enabled_ = false;
    local_78.current_limit_ = 0x7fffffff;
    local_78.buffer_size_after_limit_ = 0;
    local_78.total_bytes_limit_ = 0x7fffffff;
    local_78.recursion_budget_ = google::protobuf::io::CodedInputStream::default_recursion_limit_;
    local_78.recursion_limit_ = google::protobuf::io::CodedInputStream::default_recursion_limit_;
    local_78.disable_strict_correctness_enforcement_ = true;
    local_78.extension_pool_ = (DescriptorPool *)0x0;
    local_78.extension_factory_ = (MessageFactory *)0x0;
    local_78.input_ = (ZeroCopyInputStream *)local_c8;
    google::protobuf::io::CodedInputStream::Refresh(&local_78);
    google::protobuf::io::CodedInputStream::SetTotalBytesLimit(&local_78,0x7fffffff,-1);
    bVar1 = google::protobuf::MessageLite::ParseFromCodedStream(&this->super_MessageLite,&local_78);
    if (bVar1) {
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_f0 = 0x1c;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_f0);
      local_e8.field_2._M_allocated_capacity = local_f0;
      builtin_strncpy(local_e8._M_dataplus._M_p,"unable to deserialize object",0x1c);
      local_e8._M_string_length = local_f0;
      local_e8._M_dataplus._M_p[local_f0] = '\0';
      Result::Result(__return_storage_ptr__,FAILED_TO_DESERIALIZE,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    google::protobuf::io::CodedInputStream::~CodedInputStream(&local_78);
    google::protobuf::io::IstreamInputStream::~IstreamInputStream((IstreamInputStream *)local_c8);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    validate((Result *)local_c8,
             (out->m_spec).
             super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    __return_storage_ptr__->m_type = local_c8._0_4_;
    __return_storage_ptr__->m_reason = local_c8._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_c0);
    if (local_c0._M_p == local_b8 + 8) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_c8 = (undefined1  [8])local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"unable to open file for read","");
    Result::Result(__return_storage_ptr__,UNABLE_TO_OPEN_FILE,(string *)local_c8);
    local_b0[0]._0_8_ = local_b8;
    local_c0._M_p = (pointer)local_c8;
    if (local_c8 == (undefined1  [8])local_b8) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_c0._M_p,local_b0[0]._0_8_ + 1);
  return __return_storage_ptr__;
}

Assistant:

Result Model::load(std::istream& in, Model& out) {
        if (!in.good()) {
            return Result(ResultType::UNABLE_TO_OPEN_FILE,
                          "unable to open file for read");
        }

        
        Result r = loadSpecification(*(out.m_spec), in);
        if (!r.good()) { return r; }
        // validate on load
        
        r = out.validate();

        return r;
    }